

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          lexeme_t<cfgfile::string_trait_t> *lexeme,tag_t<cfgfile::string_trait_t> *tag)

{
  iterator *piVar1;
  lexeme_type_t lVar2;
  size_t __n;
  _Elt_pointer pptVar3;
  input_stream_t<cfgfile::string_trait_t> *piVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  exception_t<cfgfile::string_trait_t> *peVar8;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [32];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  string_t local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = lexeme->m_type;
  if (lVar2 == null) {
    peVar8 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"Unexpected end of file. In file \"","");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_1f8,local_1f8 + local_1f0);
    std::operator+(&local_e8,&local_158,&((this->m_lex).m_stream)->m_file_name);
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"\" on line ","");
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_178,local_198,local_198 + local_190);
    std::operator+(&local_c8,&local_e8,&local_178);
    string_trait_t::to_string_abi_cxx11_
              (&local_108,(string_trait_t *)(this->m_lex).m_line_number,pos);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_c8,&local_108);
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,".","");
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1b8,local_1d8,local_1d8 + local_1d0);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_1b8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar8,&local_90);
    __cxa_throw(peVar8,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if (lVar2 == finish) {
    peVar8 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "Unexpected finish curl brace. We expected tag name, but we\'ve got finish curl brace. In file \""
               ,"");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_1f8,local_1f8 + local_1f0);
    std::operator+(&local_e8,&local_158,&((this->m_lex).m_stream)->m_file_name);
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"\" on line ","");
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_178,local_198,local_198 + local_190);
    std::operator+(&local_c8,&local_e8,&local_178);
    string_trait_t::to_string_abi_cxx11_
              (&local_108,(string_trait_t *)(this->m_lex).m_line_number,pos_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_c8,&local_108);
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,".","");
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1b8,local_1d8,local_1d8 + local_1d0);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_1b8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar8,&local_70);
    __cxa_throw(peVar8,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if (lVar2 == start) {
    peVar8 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,
               "Unexpected start curl brace. We expected tag name, but we\'ve got start curl brace. In file \""
               ,"");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_1f8,local_1f8 + local_1f0);
    std::operator+(&local_e8,&local_158,&((this->m_lex).m_stream)->m_file_name);
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"\" on line ","");
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_178,local_198,local_198 + local_190);
    std::operator+(&local_c8,&local_e8,&local_178);
    string_trait_t::to_string_abi_cxx11_
              (&local_108,(string_trait_t *)(this->m_lex).m_line_number,pos_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_c8,&local_108);
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,".","");
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1b8,local_1d8,local_1d8 + local_1d0);
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_1b8);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar8,&local_50);
    __cxa_throw(peVar8,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  __n = (tag->m_name)._M_string_length;
  if (__n == (lexeme->m_value)._M_string_length) {
    if (__n != 0) {
      iVar7 = bcmp((tag->m_name)._M_dataplus._M_p,(lexeme->m_value)._M_dataplus._M_p,__n);
      if (iVar7 != 0) goto LAB_0010d421;
    }
    pptVar3 = (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar3 ==
        (this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
        super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_138._0_8_ = tag;
      std::
      deque<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
      ::_M_push_back_aux<cfgfile::tag_t<cfgfile::string_trait_t>*>
                ((deque<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>
                  *)&(this->super_parser_base_t<cfgfile::string_trait_t>).m_stack,
                 (tag_t<cfgfile::string_trait_t> **)local_138);
    }
    else {
      *pptVar3 = tag;
      piVar1 = &(this->super_parser_base_t<cfgfile::string_trait_t>).m_stack.c.
                super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    piVar4 = (this->m_lex).m_stream;
    pcVar5 = (piVar4->m_file_name)._M_dataplus._M_p;
    local_a8 = (undefined4)(this->m_lex).m_line_number;
    uStack_a4 = *(undefined4 *)((long)&(this->m_lex).m_line_number + 4);
    uStack_a0 = (undefined4)(this->m_lex).m_column_number;
    uStack_9c = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
    local_138._0_8_ = (tag_t<cfgfile::string_trait_t> *)(local_138 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar5,pcVar5 + (piVar4->m_file_name)._M_string_length);
    local_118 = local_a8;
    uStack_114 = uStack_a4;
    uStack_110 = uStack_a0;
    uStack_10c = uStack_9c;
    (*tag->_vptr_tag_t[4])(tag,(string *)local_138);
    if ((tag_t<cfgfile::string_trait_t> *)local_138._0_8_ !=
        (tag_t<cfgfile::string_trait_t> *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    bVar6 = true;
  }
  else {
LAB_0010d421:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool start_tag_parsing( const lexeme_t< Trait > & lexeme,
		tag_t< Trait > & tag )
	{
		if( lexeme.type() == lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected start curl brace. "
					"We expected tag name, but we've got start curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::finish )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected finish curl brace. "
					"We expected tag name, but we've got finish curl brace. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"In file \"" ) + m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( tag.name() == lexeme.value() )
		{
			this->m_stack.push( &tag );

			tag.on_start( parser_info_t< Trait >(
				m_lex.input_stream().file_name(),
				m_lex.line_number(),
				m_lex.column_number() ) );

			return true;
		}

		return false;
	}